

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  JSAMPROW color_map;
  JSAMPROW ptr;
  char *bufferptr;
  ppm_dest_ptr dest;
  int local_3c;
  byte *local_30;
  undefined1 *local_28;
  
  lVar1 = **(long **)(in_RDI + 0xa0);
  local_30 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  local_28 = *(undefined1 **)(in_RSI + 0x38);
  for (local_3c = *(int *)(in_RDI + 0x88); local_3c != 0; local_3c = local_3c + -1) {
    *local_28 = *(undefined1 *)(lVar1 + (ulong)*local_30);
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  fwrite(*(void **)(in_RSI + 0x38),1,*(size_t *)(in_RSI + 0x48),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JSAMPROW color_map = cinfo->colormap[0];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, color_map[*ptr++]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}